

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNDely.cpp
# Opt level: O2

void __thiscall NaPNDelay::action(NaPNDelay *this)

{
  NaReal NVar1;
  uint iOffset;
  int iVar2;
  NaVector *pNVar3;
  NaVector *pNVar4;
  undefined4 extraout_var;
  NaReal *pNVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint i;
  undefined8 uVar9;
  
  pNVar3 = NaPetriCnInput::data(&this->in);
  iOffset = (*pNVar3->_vptr_NaVector[6])(pNVar3);
  pNVar3 = &this->vBuffer;
  NaVector::shift(pNVar3,iOffset);
  for (uVar6 = 0; iOffset != uVar6; uVar6 = uVar6 + 1) {
    pNVar4 = NaPetriCnInput::data(&this->in);
    iVar2 = (*pNVar4->_vptr_NaVector[8])(pNVar4,(ulong)uVar6);
    NVar1 = *(NaReal *)CONCAT44(extraout_var,iVar2);
    pNVar5 = NaVector::operator[](pNVar3,uVar6);
    *pNVar5 = NVar1;
  }
  if ((this->bSleepValue == true) && (this->bSleepValue1st == true)) {
    uVar6 = NaPetriNode::activations(&this->super_NaPetriNode);
    if (uVar6 == 0) {
      uVar7 = iOffset;
      for (uVar6 = 1; uVar6 <= this->nMaxLag; uVar6 = uVar6 + 1) {
        for (i = 0; i != iOffset; i = i + 1) {
          pNVar5 = NaVector::operator[](pNVar3,i);
          NVar1 = *pNVar5;
          pNVar5 = NaVector::operator[](pNVar3,i + uVar7);
          *pNVar5 = NVar1;
        }
        uVar7 = uVar7 + iOffset;
      }
    }
  }
  for (uVar8 = 0; uVar8 < (uint)this->nOutDim; uVar8 = uVar8 + 1) {
    for (uVar6 = 0; iOffset != uVar6; uVar6 = uVar6 + 1) {
      pNVar5 = NaVector::operator[](pNVar3,this->piOutMap[uVar8] * iOffset + uVar6);
      NVar1 = *pNVar5;
      pNVar4 = NaPetriCnOutput::data(&this->dout);
      iVar2 = (*pNVar4->_vptr_NaVector[8])(pNVar4);
      *(NaReal *)CONCAT44(extraout_var_00,iVar2) = NVar1;
    }
  }
  if (this->bAwaken == false) {
    uVar9 = 0xbff0000000000000;
  }
  else {
    uVar9 = 0x3ff0000000000000;
  }
  pNVar3 = NaPetriCnOutput::data(&this->sync);
  iVar2 = (*pNVar3->_vptr_NaVector[8])(pNVar3,0);
  *(undefined8 *)CONCAT44(extraout_var_01,iVar2) = uVar9;
  return;
}

Assistant:

void
NaPNDelay::action ()
{
    // Portion size
    unsigned	nSize = in.data().dim();

    // Make free space in buffer area
    vBuffer.shift(nSize);

    // Copy input data to buffer
    unsigned    i, j;
    for(i = 0; i < nSize; ++i)
      {
        vBuffer[i] = in.data()[i];
      }

    // If 1st input should be used for all delays
    if(bSleepValue && bSleepValue1st && 0 == activations()) {
	for(j = 1; j <= nMaxLag; ++j)
	    for(i = 0; i < nSize; ++i)
		vBuffer[i + nSize * j] = vBuffer[i];
    }

    // Copy selected portions of stored data to output
    for(j = 0; j < nOutDim; ++j)
      for(i = 0; i < nSize; ++i)
	{
	  dout.data()[j * nSize + i] = vBuffer[piOutMap[j] * nSize + i];
	}

    // Sleep/awaken related nodes
    if(bAwaken){
        sync.data()[0] = 1.0;   // Let linked nodes to deliver data
    }else{
        sync.data()[0] = -1.0;  // Force to be passive linked nodes
    }
}